

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O1

bool __thiscall google::protobuf::compiler::python::IsWellKnownType(python *this,string_view name)

{
  int iVar1;
  size_type __rlen;
  void *__s1;
  bool bVar2;
  
  __s1 = (void *)name._M_len;
  bVar2 = false;
  switch(this) {
  case (python *)0x13:
    iVar1 = bcmp(__s1,"google.protobuf.Any",(size_t)this);
    if (iVar1 == 0) goto LAB_0030f708;
    if (this != (python *)0x16) {
      if (this != (python *)0x19) {
        if (this == (python *)0x18) goto switchD_0030f62b_caseD_18;
        goto LAB_0030f70d;
      }
      goto switchD_0030f62b_caseD_19;
    }
switchD_0030f62b_caseD_16:
    iVar1 = bcmp(__s1,"google.protobuf.Struct",(size_t)this);
    if (iVar1 == 0) {
LAB_0030f708:
      bVar2 = true;
    }
    else if (this == (python *)0x19) {
LAB_0030f6ee:
      iVar1 = bcmp(__s1,"google.protobuf.Timestamp",(size_t)this);
      bVar2 = iVar1 == 0;
    }
    else {
LAB_0030f70d:
      bVar2 = false;
    }
switchD_0030f62b_caseD_14:
    return bVar2;
  default:
    goto switchD_0030f62b_caseD_14;
  case (python *)0x16:
    goto switchD_0030f62b_caseD_16;
  case (python *)0x18:
switchD_0030f62b_caseD_18:
    iVar1 = bcmp(__s1,"google.protobuf.Duration",(size_t)this);
    if (iVar1 != 0) {
      if (this != (python *)0x16) {
        if (this == (python *)0x19) goto switchD_0030f62b_caseD_19;
        goto LAB_0030f70d;
      }
      goto switchD_0030f62b_caseD_16;
    }
    goto LAB_0030f708;
  case (python *)0x19:
switchD_0030f62b_caseD_19:
    iVar1 = bcmp(__s1,"google.protobuf.FieldMask",(size_t)this);
    if (iVar1 == 0) {
      return true;
    }
    if (this == (python *)0x16) goto switchD_0030f62b_caseD_16;
    if (this != (python *)0x19) goto LAB_0030f70d;
    iVar1 = bcmp(__s1,"google.protobuf.ListValue",0x19);
    if (iVar1 == 0) {
      return true;
    }
    goto LAB_0030f6ee;
  }
}

Assistant:

bool IsWellKnownType(const absl::string_view name) {
  // LINT.IfChange(wktbases)
  return (name == "google.protobuf.Any" ||
          name == "google.protobuf.Duration" ||
          name == "google.protobuf.FieldMask" ||
          name == "google.protobuf.ListValue" ||
          name == "google.protobuf.Struct" ||
          name == "google.protobuf.Timestamp");
  // LINT.ThenChange(//depot/google3/net/proto2/python/internal/well_known_types.py:wktbases)
}